

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

bool kratos::check_parent_param(Param *param,Generator *parent,bool check_param)

{
  int iVar1;
  undefined4 extraout_var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar2 [16];
  format_args args;
  string_view format_str;
  string local_b0;
  byte local_8a;
  byte local_89;
  bool correct;
  Generator *pGStack_88;
  bool check_param_local;
  Generator *parent_local;
  Param *param_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_70;
  basic_string_view<char> local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_8a = 1;
  local_89 = check_param;
  pGStack_88 = parent;
  parent_local = (Generator *)param;
  if (param != (Param *)0x0) {
    iVar1 = (*(param->super_Const).super_Var.super_IRNode._vptr_IRNode[0xd])();
    if ((Generator *)CONCAT44(extraout_var,iVar1) == pGStack_88) goto LAB_001f2032;
  }
  local_8a = 0;
LAB_001f2032:
  if (((local_8a & 1) == 0) && ((local_89 & 1) != 0)) {
    auVar2 = __cxa_allocate_exception(0x10);
    local_38 = &local_b0;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)anon_var_dwarf_1718b9;
    local_58.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<,char[83],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)
                    "Unable to copy var definition since the width parametrization is not set in parent"
                    ,(v7 *)parent,auVar2._8_8_);
    local_48 = &local_58;
    local_68 = fmt::v7::to_string_view<char,_0>((char *)vargs);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&param_local;
    local_30 = local_48;
    local_20 = local_48;
    local_10 = local_48;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_48->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_70.values_;
    format_str.size_ = (size_t)param_local;
    format_str.data_ = (char *)local_68.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_b0,(detail *)local_68.data_,format_str,args);
    UserException::UserException(auVar2._0_8_,&local_b0);
    __cxa_throw(auVar2._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  return (bool)(local_8a & 1);
}

Assistant:

bool check_parent_param(const Param *param, const Generator *parent, bool check_param) {
    bool correct = true;
    if (!param || param->generator() != parent) correct = false;

    if (!correct && check_param)
        throw UserException(
            ::format("Unable to copy var definition since the width parametrization is not set "
                     "in parent"));
    return correct;
}